

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_psbt.cpp
# Opt level: O0

ByteData * __thiscall
cfd::core::Psbt::GetTxInSignature
          (ByteData *__return_storage_ptr__,Psbt *this,uint32_t index,Pubkey *pubkey)

{
  long lVar1;
  uchar *key;
  size_type key_len;
  CfdException *pCVar2;
  long lVar3;
  allocator local_f9;
  uint32_t map_index;
  CfdSourceLocation local_d8;
  undefined1 local_ba;
  allocator local_b9;
  string local_b8;
  CfdSourceLocation local_98;
  int local_7c;
  int iStack_78;
  int ret;
  size_t exist;
  ByteData local_60;
  undefined1 local_48 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> key_vec;
  wally_psbt *psbt_pointer;
  Pubkey *pubkey_local;
  uint32_t index_local;
  Psbt *this_local;
  
  key_vec.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)this->wally_psbt_pointer_;
  Pubkey::GetData(&local_60,pubkey);
  ByteData::GetBytes((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_48,&local_60);
  ByteData::~ByteData(&local_60);
  _iStack_78 = 0;
  lVar1 = *(long *)(key_vec.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage + 0x10);
  key = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_48);
  key_len = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                      ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_48);
  local_7c = wally_map_find((wally_map *)(lVar1 + 0x60 + (ulong)index * 0x110),key,key_len,
                            (size_t *)&stack0xffffffffffffff88);
  if (local_7c != 0) {
    local_98.filename =
         strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/src/cfdcore_psbt.cpp"
                 ,0x2f);
    local_98.filename = local_98.filename + 1;
    local_98.line = 0xaab;
    local_98.funcname = "GetTxInSignature";
    logger::warn<int&>(&local_98,"wally_map_find NG[{}]",&local_7c);
    local_ba = 1;
    pCVar2 = (CfdException *)__cxa_allocate_exception(0x30);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)&local_b8,"psbt find signature key error.",&local_b9);
    CfdException::CfdException(pCVar2,kCfdMemoryFullError,&local_b8);
    local_ba = 0;
    __cxa_throw(pCVar2,&CfdException::typeinfo,CfdException::~CfdException);
  }
  if (_iStack_78 == 0) {
    local_d8.filename =
         strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/src/cfdcore_psbt.cpp"
                 ,0x2f);
    local_d8.filename = local_d8.filename + 1;
    local_d8.line = 0xaaf;
    local_d8.funcname = "GetTxInSignature";
    logger::warn<>(&local_d8,"target key not found.");
    pCVar2 = (CfdException *)__cxa_allocate_exception(0x30);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string
              ((string *)&map_index,"psbt signature target key not found.",&local_f9);
    CfdException::CfdException(pCVar2,kCfdIllegalStateError,(string *)&map_index);
    __cxa_throw(pCVar2,&CfdException::typeinfo,CfdException::~CfdException);
  }
  lVar1 = *(long *)(*(long *)(key_vec.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage + 0x10) + 0x60 +
                   (ulong)index * 0x110);
  lVar3 = (ulong)(iStack_78 - 1) * 0x20;
  ByteData::ByteData(__return_storage_ptr__,*(uint8_t **)(lVar1 + 0x10 + lVar3),
                     *(uint32_t *)(lVar1 + 0x18 + lVar3));
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_48);
  return __return_storage_ptr__;
}

Assistant:

ByteData Psbt::GetTxInSignature(uint32_t index, const Pubkey &pubkey) const {
  struct wally_psbt *psbt_pointer;
  psbt_pointer = static_cast<struct wally_psbt *>(wally_psbt_pointer_);
  auto key_vec = pubkey.GetData().GetBytes();
  size_t exist = 0;
  int ret = wally_map_find(
      &psbt_pointer->inputs[index].signatures, key_vec.data(), key_vec.size(),
      &exist);
  if (ret != WALLY_OK) {
    warn(CFD_LOG_SOURCE, "wally_map_find NG[{}]", ret);
    throw CfdException(kCfdMemoryFullError, "psbt find signature key error.");
  }
  if (exist == 0) {
    warn(CFD_LOG_SOURCE, "target key not found.");
    throw CfdException(
        kCfdIllegalStateError, "psbt signature target key not found.");
  }
  uint32_t map_index = static_cast<uint32_t>(exist) - 1;
  return ByteData(
      psbt_pointer->inputs[index].signatures.items[map_index].value,
      static_cast<uint32_t>(
          psbt_pointer->inputs[index].signatures.items[map_index].value_len));
}